

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O3

CURLcode Curl_auth_create_ntlm_type3_message
                   (Curl_easy *data,char *userp,char *passwdp,ntlmdata *ntlm,char **outptr,
                   size_t *outlen)

{
  uint uVar1;
  uint uVar2;
  ntlmdata *pnVar3;
  size_t sVar4;
  size_t *outlen_00;
  int iVar5;
  CURLcode CVar6;
  uint uVar7;
  char *pcVar8;
  sbyte sVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  char *__s;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint ntresplen;
  ntlmdata *local_970;
  size_t local_968;
  uchar *local_960;
  size_t *local_958;
  size_t local_950;
  char *local_948;
  ulong local_940;
  uchar *ntlmv2resp;
  long local_930;
  uchar lmbuffer [24];
  uchar ntresp [24];
  uchar lmresp [24];
  uchar entropy [8];
  uchar md5sum [16];
  uchar ntlmbuf [1024];
  char host [1025];
  
  ntresplen = 0x18;
  ntlmv2resp = (uchar *)0x0;
  local_940 = (ulong)ntlm->flags;
  memset(host,0,0x401);
  pcVar8 = strchr(userp,0x5c);
  if (pcVar8 == (char *)0x0) {
    pcVar8 = strchr(userp,0x2f);
  }
  uVar18 = (long)pcVar8 - (long)userp;
  __s = pcVar8 + 1;
  if (pcVar8 == (char *)0x0) {
    __s = userp;
  }
  local_948 = userp;
  if (pcVar8 == (char *)0x0) {
    uVar18 = 0;
    local_948 = "";
  }
  local_968 = strlen(__s);
  iVar5 = Curl_gethostname(host,0x401);
  if (iVar5 == 0) {
    local_950 = strlen(host);
  }
  else {
    local_950 = 0;
    Curl_infof(data,"gethostname() failed, continuing without!\n");
  }
  local_970 = ntlm;
  local_958 = outlen;
  if ((ntlm->flags >> 0x13 & 1) == 0) {
    if ((ntlm->flags >> 9 & 1) == 0) {
      CVar6 = Curl_ntlm_core_mk_nt_hash(data,passwdp,ntlmbuf);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      Curl_ntlm_core_lm_resp(ntlmbuf,ntlm->nonce,ntresp);
      CVar6 = Curl_ntlm_core_mk_lm_hash(data,passwdp,lmbuffer);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      local_960 = ntresp;
      Curl_ntlm_core_lm_resp(lmbuffer,ntlm->nonce,lmresp);
      uVar7 = 0x18;
    }
    else {
      CVar6 = Curl_rand(data,entropy,8);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      lmresp[0] = entropy[0];
      lmresp[1] = entropy[1];
      lmresp[2] = entropy[2];
      lmresp[3] = entropy[3];
      lmresp[4] = entropy[4];
      lmresp[5] = entropy[5];
      lmresp[6] = entropy[6];
      lmresp[7] = entropy[7];
      lmresp[8] = '\0';
      lmresp[9] = '\0';
      lmresp[10] = '\0';
      lmresp[0xb] = '\0';
      lmresp[0xc] = '\0';
      lmresp[0xd] = '\0';
      lmresp[0xe] = '\0';
      lmresp[0xf] = '\0';
      lmresp[0x10] = '\0';
      lmresp[0x11] = '\0';
      lmresp[0x12] = '\0';
      lmresp[0x13] = '\0';
      lmresp[0x14] = '\0';
      lmresp[0x15] = '\0';
      lmresp[0x16] = '\0';
      lmresp[0x17] = '\0';
      lmbuffer._0_8_ = *(undefined8 *)ntlm->nonce;
      lmbuffer[8] = entropy[0];
      lmbuffer[9] = entropy[1];
      lmbuffer[10] = entropy[2];
      lmbuffer[0xb] = entropy[3];
      lmbuffer[0xc] = entropy[4];
      lmbuffer[0xd] = entropy[5];
      lmbuffer[0xe] = entropy[6];
      lmbuffer[0xf] = entropy[7];
      CVar6 = Curl_ssl_md5sum(lmbuffer,0x10,md5sum,0x10);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      CVar6 = Curl_ntlm_core_mk_nt_hash(data,passwdp,ntlmbuf);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      local_960 = ntresp;
      Curl_ntlm_core_lm_resp(ntlmbuf,md5sum,local_960);
      uVar7 = 0x18;
    }
  }
  else {
    CVar6 = Curl_rand(data,lmbuffer,8);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    CVar6 = Curl_ntlm_core_mk_nt_hash(data,passwdp,ntlmbuf);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    CVar6 = Curl_ntlm_core_mk_ntlmv2_hash(__s,local_968,local_948,uVar18,ntlmbuf,ntresp);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    CVar6 = Curl_ntlm_core_mk_lmv2_resp(ntresp,lmbuffer,ntlm->nonce,lmresp);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    CVar6 = Curl_ntlm_core_mk_ntlmv2_resp(ntresp,lmbuffer,ntlm,&ntlmv2resp,&ntresplen);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    local_960 = ntlmv2resp;
    uVar7 = ntresplen;
  }
  uVar10 = (uint)local_940 & 1;
  local_940 = (ulong)uVar10;
  sVar9 = (sbyte)uVar10;
  local_930 = local_950 << sVar9;
  lVar14 = local_968 << sVar9;
  lVar15 = uVar18 << sVar9;
  uVar1 = (uint)lVar15;
  uVar17 = uVar1 + uVar7 + 0x58;
  uVar2 = (uint)lVar14;
  uVar20 = (ulong)(uVar7 >> 8 & 0xff);
  uVar16 = (ulong)(uVar1 >> 8 & 0xff);
  uVar12 = (ulong)(uVar2 >> 8 & 0xff);
  uVar19 = (ulong)((uint)local_930 & 0xff);
  uVar11 = (ulong)((uint)local_930 >> 8 & 0xff);
  uVar10 = local_970->flags;
  uVar7 = curl_msnprintf((char *)ntlmbuf,0x400,
                         "NTLMSSP%c\x03%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c"
                         ,0,0,0,0,0x18,0,0x18,0,0x40,0,0,0,(ulong)(uVar7 & 0xff),uVar20,
                         (ulong)(uVar7 & 0xff),uVar20,0x58,0,0,0,(ulong)(uVar1 & 0xff),uVar16,
                         (ulong)(uVar1 & 0xff),uVar16,(ulong)(uVar7 + 0x58 & 0xff),
                         (ulong)(uVar7 + 0x58 >> 8 & 0xff),0,0,(ulong)(uVar2 & 0xff),uVar12,
                         (ulong)(uVar2 & 0xff),uVar12,(ulong)(uVar17 & 0xff),
                         (ulong)(uVar17 >> 8 & 0xff),0,0,uVar19,uVar11,uVar19,uVar11,
                         (ulong)(uVar17 + uVar2 & 0xff),(ulong)(uVar17 + uVar2 >> 8 & 0xff),0,0,0,0,
                         0,0,0,0,0,0,(ulong)(uVar10 & 0xff),(ulong)(uVar10 >> 8 & 0xff),
                         (ulong)(uVar10 >> 0x10 & 0xff),(ulong)(uVar10 >> 0x18));
  outlen_00 = local_958;
  lVar13 = (long)(int)uVar7;
  if (uVar7 < 1000) {
    *(undefined8 *)(ntlmbuf + lVar13 + 0x10) = lmresp._16_8_;
    *(undefined8 *)(ntlmbuf + lVar13) = lmresp._0_8_;
    *(undefined8 *)(ntlmbuf + lVar13 + 8) = lmresp._8_8_;
    lVar13 = lVar13 + 0x18;
  }
  uVar11 = (ulong)ntresplen;
  uVar19 = lVar13 + uVar11;
  if (uVar19 < 0x401) {
    memcpy(ntlmbuf + lVar13,local_960,uVar11);
    (*Curl_cfree)(ntlmv2resp);
    if (local_930 + uVar19 + lVar15 + lVar14 < 0x400) {
      if ((int)local_940 == 0) {
        memcpy(ntlmbuf + uVar19,local_948,uVar18);
        sVar4 = local_968;
        memcpy(ntlmbuf + uVar19 + uVar18,__s,local_968);
        uVar19 = uVar19 + uVar18 + sVar4;
        memcpy(ntlmbuf + uVar19,host,local_950);
      }
      else {
        if ((uVar18 & 0x7fffffffffffffff) != 0) {
          uVar12 = 0;
          do {
            ntlmbuf[uVar12 * 2 + lVar13 + uVar11] = local_948[uVar12];
            ntlmbuf[uVar12 * 2 + lVar13 + uVar11 + 1] = '\0';
            uVar12 = uVar12 + 1;
          } while ((uVar18 & 0x7fffffffffffffff) != uVar12);
          uVar19 = uVar19 + lVar15;
        }
        if ((local_968 & 0x7fffffffffffffff) != 0) {
          uVar18 = 0;
          do {
            ntlmbuf[uVar18 * 2 + uVar19] = __s[uVar18];
            ntlmbuf[uVar18 * 2 + uVar19 + 1] = '\0';
            uVar18 = uVar18 + 1;
          } while ((local_968 & 0x7fffffffffffffff) != uVar18);
          uVar19 = uVar19 + lVar14;
        }
        if ((local_950 & 0x7fffffffffffffff) != 0) {
          uVar18 = 0;
          do {
            ntlmbuf[uVar18 * 2 + uVar19] = host[uVar18];
            ntlmbuf[uVar18 * 2 + uVar19 + 1] = '\0';
            uVar18 = uVar18 + 1;
          } while ((local_950 & 0x7fffffffffffffff) != uVar18);
        }
      }
      pnVar3 = local_970;
      CVar6 = Curl_base64_encode(data,(char *)ntlmbuf,uVar19 + local_930,outptr,outlen_00);
      (*Curl_cfree)(pnVar3->target_info);
      pnVar3->target_info = (void *)0x0;
      pnVar3->target_info_len = 0;
      return CVar6;
    }
    pcVar8 = "user + domain + host name too big";
  }
  else {
    pcVar8 = "incoming NTLM message too big";
  }
  Curl_failf(data,pcVar8);
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_auth_create_ntlm_type3_message(struct Curl_easy *data,
                                             const char *userp,
                                             const char *passwdp,
                                             struct ntlmdata *ntlm,
                                             char **outptr, size_t *outlen)

{
  /* NTLM type-3 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x03000000)
           12    LM/LMv2 Response       security buffer
           20    NTLM/NTLMv2 Response   security buffer
           28    Target Name            security buffer
           36    User Name              security buffer
           44    Workstation Name       security buffer
          (52)   Session Key            security buffer (*)
          (60)   Flags                  long (*)
          (64)   OS Version Structure   8 bytes (*)
  52 (64) (72)   Start of data block
                                          (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  size_t size;
  unsigned char ntlmbuf[NTLM_BUFSIZE];
  int lmrespoff;
  unsigned char lmresp[24]; /* fixed-size */
#ifdef USE_NTRESPONSES
  int ntrespoff;
  unsigned int ntresplen = 24;
  unsigned char ntresp[24]; /* fixed-size */
  unsigned char *ptr_ntresp = &ntresp[0];
  unsigned char *ntlmv2resp = NULL;
#endif
  bool unicode = (ntlm->flags & NTLMFLAG_NEGOTIATE_UNICODE) ? TRUE : FALSE;
  char host[HOSTNAME_MAX + 1] = "";
  const char *user;
  const char *domain = "";
  size_t hostoff = 0;
  size_t useroff = 0;
  size_t domoff = 0;
  size_t hostlen = 0;
  size_t userlen = 0;
  size_t domlen = 0;

  user = strchr(userp, '\\');
  if(!user)
    user = strchr(userp, '/');

  if(user) {
    domain = userp;
    domlen = (user - domain);
    user++;
  }
  else
    user = userp;

  userlen = strlen(user);

  /* Get the machine's un-qualified host name as NTLM doesn't like the fully
     qualified domain name */
  if(Curl_gethostname(host, sizeof(host))) {
    infof(data, "gethostname() failed, continuing without!\n");
    hostlen = 0;
  }
  else {
    hostlen = strlen(host);
  }

#if defined(USE_NTRESPONSES) && defined(USE_NTLM_V2)
  if(ntlm->flags & NTLMFLAG_NEGOTIATE_NTLM2_KEY) {
    unsigned char ntbuffer[0x18];
    unsigned char entropy[8];
    unsigned char ntlmv2hash[0x18];

    result = Curl_rand(data, entropy, 8);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_ntlmv2_hash(user, userlen, domain, domlen,
                                           ntbuffer, ntlmv2hash);
    if(result)
      return result;

    /* LMv2 response */
    result = Curl_ntlm_core_mk_lmv2_resp(ntlmv2hash, entropy,
                                         &ntlm->nonce[0], lmresp);
    if(result)
      return result;

    /* NTLMv2 response */
    result = Curl_ntlm_core_mk_ntlmv2_resp(ntlmv2hash, entropy,
                                           ntlm, &ntlmv2resp, &ntresplen);
    if(result)
      return result;

    ptr_ntresp = ntlmv2resp;
  }
  else
#endif

#if defined(USE_NTRESPONSES) && defined(USE_NTLM2SESSION)
  /* We don't support NTLM2 if we don't have USE_NTRESPONSES */
  if(ntlm->flags & NTLMFLAG_NEGOTIATE_NTLM_KEY) {
    unsigned char ntbuffer[0x18];
    unsigned char tmp[0x18];
    unsigned char md5sum[MD5_DIGEST_LENGTH];
    unsigned char entropy[8];

    /* Need to create 8 bytes random data */
    result = Curl_rand(data, entropy, 8);
    if(result)
      return result;

    /* 8 bytes random data as challenge in lmresp */
    memcpy(lmresp, entropy, 8);

    /* Pad with zeros */
    memset(lmresp + 8, 0, 0x10);

    /* Fill tmp with challenge(nonce?) + entropy */
    memcpy(tmp, &ntlm->nonce[0], 8);
    memcpy(tmp + 8, entropy, 8);

    result = Curl_ssl_md5sum(tmp, 16, md5sum, MD5_DIGEST_LENGTH);
    if(!result)
      /* We shall only use the first 8 bytes of md5sum, but the des code in
         Curl_ntlm_core_lm_resp only encrypt the first 8 bytes */
      result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, md5sum, ntresp);

    /* End of NTLM2 Session code */
    /* NTLM v2 session security is a misnomer because it is not NTLM v2.
       It is NTLM v1 using the extended session security that is also
       in NTLM v2 */
  }
  else
#endif
  {

#ifdef USE_NTRESPONSES
    unsigned char ntbuffer[0x18];
#endif
    unsigned char lmbuffer[0x18];

#ifdef USE_NTRESPONSES
    result = Curl_ntlm_core_mk_nt_hash(data, passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], ntresp);
#endif

    result = Curl_ntlm_core_mk_lm_hash(data, passwdp, lmbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(lmbuffer, &ntlm->nonce[0], lmresp);

    /* A safer but less compatible alternative is:
     *   Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], lmresp);
     * See https://davenport.sourceforge.io/ntlm.html#ntlmVersion2 */
  }

  if(unicode) {
    domlen = domlen * 2;
    userlen = userlen * 2;
    hostlen = hostlen * 2;
  }

  lmrespoff = 64; /* size of the message header */
#ifdef USE_NTRESPONSES
  ntrespoff = lmrespoff + 0x18;
  domoff = ntrespoff + ntresplen;
#else
  domoff = lmrespoff + 0x18;
#endif
  useroff = domoff + domlen;
  hostoff = useroff + userlen;

  /* Create the big type-3 message binary blob */
  size = msnprintf((char *)ntlmbuf, NTLM_BUFSIZE,
                   NTLMSSP_SIGNATURE "%c"
                   "\x03%c%c%c"  /* 32-bit type = 3 */

                   "%c%c"  /* LanManager length */
                   "%c%c"  /* LanManager allocated space */
                   "%c%c"  /* LanManager offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* NT-response length */
                   "%c%c"  /* NT-response allocated space */
                   "%c%c"  /* NT-response offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* domain length */
                   "%c%c"  /* domain allocated space */
                   "%c%c"  /* domain name offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* user length */
                   "%c%c"  /* user allocated space */
                   "%c%c"  /* user offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* host length */
                   "%c%c"  /* host allocated space */
                   "%c%c"  /* host offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* session key length (unknown purpose) */
                   "%c%c"  /* session key allocated space (unknown purpose) */
                   "%c%c"  /* session key offset (unknown purpose) */
                   "%c%c"  /* 2 zeroes */

                   "%c%c%c%c",  /* flags */

                   /* domain string */
                   /* user string */
                   /* host string */
                   /* LanManager response */
                   /* NT response */

                   0,                /* zero termination */
                   0, 0, 0,          /* type-3 long, the 24 upper bits */

                   SHORTPAIR(0x18),  /* LanManager response length, twice */
                   SHORTPAIR(0x18),
                   SHORTPAIR(lmrespoff),
                   0x0, 0x0,

#ifdef USE_NTRESPONSES
                   SHORTPAIR(ntresplen),  /* NT-response length, twice */
                   SHORTPAIR(ntresplen),
                   SHORTPAIR(ntrespoff),
                   0x0, 0x0,
#else
                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,
#endif
                   SHORTPAIR(domlen),
                   SHORTPAIR(domlen),
                   SHORTPAIR(domoff),
                   0x0, 0x0,

                   SHORTPAIR(userlen),
                   SHORTPAIR(userlen),
                   SHORTPAIR(useroff),
                   0x0, 0x0,

                   SHORTPAIR(hostlen),
                   SHORTPAIR(hostlen),
                   SHORTPAIR(hostoff),
                   0x0, 0x0,

                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,

                   LONGQUARTET(ntlm->flags));

  DEBUGASSERT(size == 64);
  DEBUGASSERT(size == (size_t)lmrespoff);

  /* We append the binary hashes */
  if(size < (NTLM_BUFSIZE - 0x18)) {
    memcpy(&ntlmbuf[size], lmresp, 0x18);
    size += 0x18;
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE3 header lmresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[lmrespoff], 0x18);
  });

#ifdef USE_NTRESPONSES
  /* ntresplen + size should not be risking an integer overflow here */
  if(ntresplen + size > sizeof(ntlmbuf)) {
    failf(data, "incoming NTLM message too big");
    return CURLE_OUT_OF_MEMORY;
  }
  DEBUGASSERT(size == (size_t)ntrespoff);
  memcpy(&ntlmbuf[size], ptr_ntresp, ntresplen);
  size += ntresplen;

  DEBUG_OUT({
    fprintf(stderr, "\n   ntresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[ntrespoff], ntresplen);
  });

  free(ntlmv2resp);/* Free the dynamic buffer allocated for NTLMv2 */

#endif

  DEBUG_OUT({
    fprintf(stderr, "\n   flags=0x%02.2x%02.2x%02.2x%02.2x 0x%08.8x ",
            LONGQUARTET(ntlm->flags), ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n****\n");
  });

  /* Make sure that the domain, user and host strings fit in the
     buffer before we copy them there. */
  if(size + userlen + domlen + hostlen >= NTLM_BUFSIZE) {
    failf(data, "user + domain + host name too big");
    return CURLE_OUT_OF_MEMORY;
  }

  DEBUGASSERT(size == domoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], domain, domlen / 2);
  else
    memcpy(&ntlmbuf[size], domain, domlen);

  size += domlen;

  DEBUGASSERT(size == useroff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], user, userlen / 2);
  else
    memcpy(&ntlmbuf[size], user, userlen);

  size += userlen;

  DEBUGASSERT(size == hostoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], host, hostlen / 2);
  else
    memcpy(&ntlmbuf[size], host, hostlen);

  size += hostlen;

  /* Convert domain, user, and host to ASCII but leave the rest as-is */
  result = Curl_convert_to_network(data, (char *)&ntlmbuf[domoff],
                                   size - domoff);
  if(result)
    return CURLE_CONV_FAILED;

  /* Return with binary blob encoded into base64 */
  result = Curl_base64_encode(data, (char *)ntlmbuf, size, outptr, outlen);

  Curl_auth_cleanup_ntlm(ntlm);

  return result;
}